

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmGraphicsShaderTestUtil.cpp
# Opt level: O0

void vkt::SpirVAssembly::addTessCtrlTest
               (TestCaseGroup *group,char *name,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *fragments)

{
  undefined4 in_stack_fffffffffffffacc;
  string *in_stack_fffffffffffffad8;
  ShaderElement *local_4e8;
  VkShaderStageFlagBits *local_440;
  string local_438 [32];
  map<vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
  local_418;
  InstanceContext local_3e0;
  allocator<char> local_2f9;
  string local_2f8;
  allocator<char> local_2d1;
  string local_2d0;
  undefined1 local_2aa;
  allocator<char> local_2a9;
  string local_2a8;
  allocator<char> local_281;
  string local_280;
  allocator<char> local_259;
  string local_258;
  allocator<char> local_231;
  string local_230;
  allocator<char> local_209;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  allocator<char> local_1b9;
  string local_1b8;
  allocator<char> local_181;
  string local_180;
  VkShaderStageFlagBits *local_160;
  undefined1 local_158 [8];
  ShaderElement pipelineStages [4];
  RGBA defaultColors [4];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *fragments_local;
  char *name_local;
  TestCaseGroup *group_local;
  
  local_440 = &pipelineStages[3].stage;
  do {
    tcu::RGBA::RGBA((RGBA *)local_440);
    local_440 = local_440 + 1;
  } while ((RGBA *)local_440 != defaultColors + 2);
  getDefaultColors((RGBA (*) [4])&pipelineStages[3].stage);
  local_2aa = 1;
  local_160 = (VkShaderStageFlagBits *)local_158;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"vert",&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"main",&local_1b9);
  ShaderElement::ShaderElement
            ((ShaderElement *)local_158,&local_180,&local_1b8,VK_SHADER_STAGE_VERTEX_BIT);
  local_160 = &pipelineStages[0].stage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"tessc",&local_1e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"main",&local_209);
  ShaderElement::ShaderElement
            ((ShaderElement *)&pipelineStages[0].stage,&local_1e0,&local_208,
             VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT);
  local_160 = &pipelineStages[1].stage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"tesse",&local_231);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"main",&local_259);
  ShaderElement::ShaderElement
            ((ShaderElement *)&pipelineStages[1].stage,&local_230,&local_258,
             VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT);
  local_160 = &pipelineStages[2].stage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,"frag",&local_281);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"main",&local_2a9);
  ShaderElement::ShaderElement
            ((ShaderElement *)&pipelineStages[2].stage,&local_280,&local_2a8,
             VK_SHADER_STAGE_FRAGMENT_BIT);
  local_2aa = 0;
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator(&local_2a9);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator(&local_281);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator(&local_231);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator(&local_209);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,name,&local_2d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,"",&local_2f9);
  local_418._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_418._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_418._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_418._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_418._M_t._M_impl._0_8_ = 0;
  local_418._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_418._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::
  map<vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::map(&local_418);
  std::__cxx11::string::string(local_438);
  createInstanceContext<4ul>
            (&local_3e0,(SpirVAssembly *)local_158,(ShaderElement (*) [4])&pipelineStages[3].stage,
             (RGBA (*) [4])&pipelineStages[3].stage,(RGBA (*) [4])fragments,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_418,(StageToSpecConstantMap *)CONCAT44(in_stack_fffffffffffffacc,1),
             (qpTestResult)local_438,in_stack_fffffffffffffad8);
  addFunctionCaseWithPrograms<vkt::SpirVAssembly::InstanceContext>
            (group,&local_2d0,&local_2f8,addShaderCodeCustomTessControl,runAndVerifyDefaultPipeline,
             &local_3e0);
  InstanceContext::~InstanceContext(&local_3e0);
  std::__cxx11::string::~string(local_438);
  std::
  map<vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~map(&local_418);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::allocator<char>::~allocator(&local_2f9);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::allocator<char>::~allocator(&local_2d1);
  local_4e8 = (ShaderElement *)&pipelineStages[3].stage;
  do {
    local_4e8 = local_4e8 + -1;
    ShaderElement::~ShaderElement(local_4e8);
  } while (local_4e8 != (ShaderElement *)local_158);
  return;
}

Assistant:

void addTessCtrlTest(tcu::TestCaseGroup* group, const char* name, const map<string, string>& fragments)
{
	RGBA defaultColors[4];
	getDefaultColors(defaultColors);
	const ShaderElement pipelineStages[] =
	{
		ShaderElement("vert", "main", VK_SHADER_STAGE_VERTEX_BIT),
		ShaderElement("tessc", "main", VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT),
		ShaderElement("tesse", "main", VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT),
		ShaderElement("frag", "main", VK_SHADER_STAGE_FRAGMENT_BIT),
	};

	addFunctionCaseWithPrograms<InstanceContext>(group, name, "", addShaderCodeCustomTessControl,
												 runAndVerifyDefaultPipeline, createInstanceContext(
													 pipelineStages, defaultColors, defaultColors, fragments, StageToSpecConstantMap()));
}